

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

bool __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base*>,phmap::priv::HashEq<cs::method_base*,void>::Hash,phmap::priv::HashEq<cs::method_base*,void>::Eq,std::allocator<cs::method_base*>>
::find_impl<cs::method_base*>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base*>,phmap::priv::HashEq<cs::method_base*,void>::Hash,phmap::priv::HashEq<cs::method_base*,void>::Eq,std::allocator<cs::method_base*>>
           *this,key_arg<cs::method_base_*> *key,size_t hashval,size_t *offset)

{
  char *pcVar1;
  long lVar2;
  key_arg<cs::method_base_*> pmVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  __m128i match;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  probe_seq<16UL> seq;
  probe_seq<16UL> local_40;
  char cVar26;
  char cVar28;
  char cVar29;
  char cVar30;
  
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
  ::probe(&local_40,
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
           *)this,hashval);
  lVar2 = *(long *)this;
  auVar24 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar24 = pshuflw(auVar24,auVar24,0);
  while( true ) {
    pcVar1 = (char *)(lVar2 + local_40.offset_);
    cVar5 = *pcVar1;
    cVar6 = pcVar1[1];
    cVar7 = pcVar1[2];
    cVar8 = pcVar1[3];
    cVar9 = pcVar1[4];
    cVar10 = pcVar1[5];
    cVar11 = pcVar1[6];
    cVar12 = pcVar1[7];
    cVar13 = pcVar1[8];
    cVar14 = pcVar1[9];
    cVar15 = pcVar1[10];
    cVar16 = pcVar1[0xb];
    cVar17 = pcVar1[0xc];
    cVar18 = pcVar1[0xd];
    cVar19 = pcVar1[0xe];
    cVar20 = pcVar1[0xf];
    cVar26 = auVar24[0];
    auVar27[0] = -(cVar26 == cVar5);
    cVar28 = auVar24[1];
    auVar27[1] = -(cVar28 == cVar6);
    cVar29 = auVar24[2];
    auVar27[2] = -(cVar29 == cVar7);
    cVar30 = auVar24[3];
    auVar27[3] = -(cVar30 == cVar8);
    auVar27[4] = -(cVar26 == cVar9);
    auVar27[5] = -(cVar28 == cVar10);
    auVar27[6] = -(cVar29 == cVar11);
    auVar27[7] = -(cVar30 == cVar12);
    auVar27[8] = -(cVar26 == cVar13);
    auVar27[9] = -(cVar28 == cVar14);
    auVar27[10] = -(cVar29 == cVar15);
    auVar27[0xb] = -(cVar30 == cVar16);
    auVar27[0xc] = -(cVar26 == cVar17);
    auVar27[0xd] = -(cVar28 == cVar18);
    auVar27[0xe] = -(cVar29 == cVar19);
    auVar27[0xf] = -(cVar30 == cVar20);
    lVar21 = *(long *)(this + 8);
    pmVar3 = *key;
    for (uVar22 = (uint)(ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                                (ushort)(auVar27[0xf] >> 7) << 0xf); uVar22 != 0;
        uVar22 = uVar22 - 1 & uVar22) {
      uVar4 = 0;
      if (uVar22 != 0) {
        for (; (uVar22 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar23 = uVar4 + local_40.offset_ & local_40.mask_;
      *offset = uVar23;
      if (*(key_arg<cs::method_base_*> *)(lVar21 + uVar23 * 8) == pmVar3) goto LAB_002b5e75;
    }
    auVar25[0] = -(cVar5 == -0x80);
    auVar25[1] = -(cVar6 == -0x80);
    auVar25[2] = -(cVar7 == -0x80);
    auVar25[3] = -(cVar8 == -0x80);
    auVar25[4] = -(cVar9 == -0x80);
    auVar25[5] = -(cVar10 == -0x80);
    auVar25[6] = -(cVar11 == -0x80);
    auVar25[7] = -(cVar12 == -0x80);
    auVar25[8] = -(cVar13 == -0x80);
    auVar25[9] = -(cVar14 == -0x80);
    auVar25[10] = -(cVar15 == -0x80);
    auVar25[0xb] = -(cVar16 == -0x80);
    auVar25[0xc] = -(cVar17 == -0x80);
    auVar25[0xd] = -(cVar18 == -0x80);
    auVar25[0xe] = -(cVar19 == -0x80);
    auVar25[0xf] = -(cVar20 == -0x80);
    if ((((((((((((((((auVar25 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar25 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar25 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar25 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar25 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar25 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar25 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar25 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar25 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar25 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar25 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar25 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar25 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar20 == -0x80)
    break;
    lVar21 = local_40.offset_ + local_40.index_;
    local_40.index_ = local_40.index_ + 0x10;
    local_40.offset_ = lVar21 + 0x10U & local_40.mask_;
  }
LAB_002b5e75:
  return uVar22 != 0;
}

Assistant:

bool find_impl(const key_arg<K>& key, size_t hashval, size_t& offset)
			{
				auto seq = probe(hashval);
				while (true) {
					Group g{ ctrl_ + seq.offset() };
					for (uint32_t i : g.Match((h2_t)H2(hashval))) {
						offset = seq.offset((size_t)i);
						if (PHMAP_PREDICT_TRUE(PolicyTraits::apply(
						                           EqualElement<K> {key, eq_ref()},
						                           PolicyTraits::element(slots_ + offset))))
							return true;
					}
					if (PHMAP_PREDICT_TRUE(g.MatchEmpty()))
						return false;
					seq.next();
				}
			}